

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::VertexAttributePointerCase::test
          (VertexAttributePointerCase *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  GLfloat vertexData [4];
  PointerData pointers [10];
  StateQueryMemoryWriteGuard<void_*> state;
  StateQueryMemoryWriteGuard<void_*> initialState;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::StateQueryMemoryWriteGuard
            (&initialState);
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetVertexAttribPointerv(this_00,0,0x8645,&initialState.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::verifyValidity
            (&initialState,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  checkPointerEquals((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     initialState.m_value,(void *)0x0);
  pointers[0].size = 1;
  pointers[0].type = 0x1400;
  pointers[0].stride = 0;
  pointers[0].pointer = vertexData + 2;
  pointers[0].normalized = '\0';
  pointers[1].size = 1;
  pointers[1].type = 0x1402;
  pointers[1].stride = 0;
  pointers[1].normalized = '\0';
  pointers[1].pointer = vertexData + 1;
  pointers[2].size = 1;
  pointers[2].type = 0x140c;
  pointers[2].stride = 0;
  pointers[2].normalized = '\0';
  pointers[2].pointer = pointers[0].pointer;
  pointers[3].size = 1;
  pointers[3].type = 0x140c;
  pointers[3].stride = 0;
  pointers[3].normalized = '\0';
  pointers[3].pointer = pointers[1].pointer;
  pointers[4].size = 1;
  pointers[4].type = 0x1406;
  pointers[4].stride = 0;
  pointers[4].normalized = '\0';
  pointers[4].pointer = vertexData;
  pointers[5].size = 1;
  pointers[5].type = 0x1406;
  pointers[5].stride = 0;
  pointers[5].normalized = '\0';
  pointers[5].pointer = vertexData + 3;
  pointers[6].size = 1;
  pointers[6].type = 0x1406;
  pointers[6].stride = 0;
  pointers[6].normalized = '\0';
  pointers[6].pointer = pointers[0].pointer;
  pointers[7].size = 1;
  pointers[7].type = 0x1403;
  pointers[7].stride = 0;
  pointers[7].normalized = '\0';
  pointers[7].pointer = vertexData;
  pointers[8].size = 4;
  pointers[8].type = 0x1403;
  pointers[8].stride = 0;
  vertexData[0] = 0.0;
  vertexData[1] = 0.0;
  vertexData[2] = 0.0;
  vertexData[3] = 0.0;
  pointers[8].normalized = '\0';
  pointers[8].pointer = pointers[1].pointer;
  pointers[9].size = 4;
  pointers[9].type = 0x1403;
  pointers[9].stride = 0;
  pointers[9].normalized = '\0';
  pointers[9].pointer = pointers[0].pointer;
  for (lVar1 = 0x10; lVar1 != 0x100; lVar1 = lVar1 + 0x18) {
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,0,*(GLint *)((long)vertexData + lVar1),
               *(GLenum *)((long)vertexData + lVar1 + 4),
               *(GLboolean *)((long)vertexData + lVar1 + 0xc),
               *(GLsizei *)((long)vertexData + lVar1 + 8),
               *(void **)((long)&pointers[0].size + lVar1));
    ApiCase::expectError(&this->super_ApiCase,0);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::StateQueryMemoryWriteGuard
              (&state);
    glu::CallLogWrapper::glGetVertexAttribPointerv(this_00,0,0x8645,&state.m_value);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::verifyValidity
              (&state,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    checkPointerEquals((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       state.m_value,*(void **)((long)&pointers[0].size + lVar1));
  }
  return;
}

Assistant:

void test (void)
	{
		StateQueryMemoryWriteGuard<GLvoid*> initialState;
		glGetVertexAttribPointerv(0, GL_VERTEX_ATTRIB_ARRAY_POINTER, &initialState);
		initialState.verifyValidity(m_testCtx);
		checkPointerEquals(m_testCtx, initialState, 0);

		GLfloat vertexData[4] = {0.0f}; // never accessed
		const PointerData pointers[] =
		{
			{ 1, GL_BYTE,				0,	GL_FALSE, &vertexData[2] },
			{ 1, GL_SHORT,				0,	GL_FALSE, &vertexData[1] },
			{ 1, GL_FIXED,				0,	GL_FALSE, &vertexData[2] },
			{ 1, GL_FIXED,				0,	GL_FALSE, &vertexData[1] },
			{ 1, GL_FLOAT,				0,	GL_FALSE, &vertexData[0] },
			{ 1, GL_FLOAT,				0,	GL_FALSE, &vertexData[3] },
			{ 1, GL_FLOAT,				0,	GL_FALSE, &vertexData[2] },
			{ 1, GL_UNSIGNED_SHORT,		0,	GL_FALSE, &vertexData[0] },
			{ 4, GL_UNSIGNED_SHORT,		0,	GL_FALSE, &vertexData[1] },
			{ 4, GL_UNSIGNED_SHORT,		0,	GL_FALSE, &vertexData[2] },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
		{
			glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].normalized, pointers[ndx].stride, pointers[ndx].pointer);
			expectError(GL_NO_ERROR);

			StateQueryMemoryWriteGuard<GLvoid*> state;
			glGetVertexAttribPointerv(0, GL_VERTEX_ATTRIB_ARRAY_POINTER, &state);
			state.verifyValidity(m_testCtx);
			checkPointerEquals(m_testCtx, state, pointers[ndx].pointer);
		}
	}